

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

int s2pred::TriageCompareSin2Distance<double>(Vector3<double> *x,Vector3<double> *y,double r2)

{
  ostream *poVar1;
  double dVar2;
  double dVar3;
  int local_a4;
  double error;
  double diff;
  double sin2_r_error;
  double sin2_r;
  double sin2_xy;
  double sin2_xy_error;
  double T_ERR;
  byte local_39;
  S2LogMessage local_38;
  S2LogMessageVoidify local_21;
  double local_20;
  double r2_local;
  Vector3<double> *y_local;
  Vector3<double> *x_local;
  
  local_39 = 0;
  local_20 = r2;
  r2_local = (double)y;
  y_local = x;
  if (2.0 <= r2) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
               ,0x1e8,kFatal,(ostream *)&std::cerr);
    local_39 = 1;
    poVar1 = S2LogMessage::stream(&local_38);
    poVar1 = std::operator<<(poVar1,"Check failed: (r2) < (2.0) ");
    S2LogMessageVoidify::operator&(&local_21,poVar1);
  }
  if ((local_39 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_38);
  }
  sin2_xy_error = 1.1102230246251565e-16;
  dVar2 = GetSin2Distance(y_local,(S2Point *)r2_local,&sin2_xy);
  local_20 = local_20 * (1.0 - local_20 * 0.25);
  dVar2 = dVar2 - local_20;
  dVar3 = sin2_xy + local_20 * 3.3306690738754696e-16;
  if (dVar2 <= dVar3) {
    local_a4 = 0;
    if (dVar2 < -dVar3) {
      local_a4 = -1;
    }
  }
  else {
    local_a4 = 1;
  }
  return local_a4;
}

Assistant:

int TriageCompareSin2Distance(const Vector3<T>& x, const Vector3<T>& y, T r2) {
  S2_DCHECK_LT(r2, 2.0);  // Only valid for distance limits < 90 degrees.

  constexpr T T_ERR = rounding_epsilon<T>();
  T sin2_xy_error;
  T sin2_xy = GetSin2Distance(x, y, &sin2_xy_error);
  T sin2_r = r2 * (1 - 0.25 * r2);
  T sin2_r_error = 3 * T_ERR * sin2_r;
  T diff = sin2_xy - sin2_r;
  T error = sin2_xy_error + sin2_r_error;
  return (diff > error) ? 1 : (diff < -error) ? -1 : 0;
}